

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cpp
# Opt level: O2

void __thiscall icu_63::StringPiece::StringPiece(StringPiece *this,char *str)

{
  int32_t iVar1;
  size_t sVar2;
  
  this->ptr_ = str;
  if (str == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    sVar2 = strlen(str);
    iVar1 = (int32_t)sVar2;
  }
  this->length_ = iVar1;
  return;
}

Assistant:

StringPiece::StringPiece(const StringPiece& x, int32_t pos) {
  if (pos < 0) {
    pos = 0;
  } else if (pos > x.length_) {
    pos = x.length_;
  }
  ptr_ = x.ptr_ + pos;
  length_ = x.length_ - pos;
}